

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

bool __thiscall TextField::update(TextField *this,TextEvent textEvent)

{
  Vector2f VVar1;
  int iVar2;
  Text *this_00;
  Transformable *this_01;
  uint in_ESI;
  long in_RDI;
  string s;
  String *in_stack_fffffffffffffef8;
  Text *in_stack_ffffffffffffff00;
  String *in_stack_ffffffffffffff28;
  locale *local_c8;
  Text *in_stack_ffffffffffffff48;
  String *in_stack_ffffffffffffff50;
  locale *this_02;
  float local_a0;
  locale local_98 [40];
  Vector2f local_70;
  locale local_68 [56];
  string local_30 [44];
  uint local_4;
  
  if ((((*(byte *)(in_RDI + 0xb1) & 1) != 0) && ((*(byte *)(in_RDI + 0x651) & 1) != 0)) &&
     ((*(byte *)(in_RDI + 0x650) & 1) != 0)) {
    local_4 = in_ESI;
    sf::Text::getString((Text *)(in_RDI + 0x228));
    sf::String::operator_cast_to_string(in_stack_ffffffffffffff28);
    if ((local_4 == 8) && (0 < *(int *)(in_RDI + 0x648))) {
      std::__cxx11::string::erase((ulong)local_30,(long)(*(int *)(in_RDI + 0x648) + -1));
      this_00 = (Text *)(in_RDI + 0x228);
      this_02 = local_68;
      std::locale::locale(this_02);
      sf::String::String((String *)this_02,(string *)this_00,local_c8);
      sf::Text::setString(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      sf::String::~String((String *)0x1a9678);
      std::locale::~locale(local_68);
      *(int *)(in_RDI + 0x648) = *(int *)(in_RDI + 0x648) + -1;
      local_70 = sf::Text::findCharacterPos(this_00,(size_t)local_c8);
      sf::Transformable::setPosition((Transformable *)(in_RDI + 0x4f8),local_70.x,2.0);
    }
    else if (local_4 == 0x1b) {
      *(undefined1 *)(in_RDI + 0x650) = 0;
    }
    else if (((0x1f < local_4) && (local_4 < 0x7f)) &&
            (iVar2 = std::__cxx11::string::length(), iVar2 < *(int *)(in_RDI + 0x64c))) {
      std::__cxx11::string::insert((ulong)local_30,(long)*(int *)(in_RDI + 0x648),'\x01');
      std::locale::locale(local_98);
      sf::String::String(in_stack_ffffffffffffff50,(string *)in_stack_ffffffffffffff48,local_c8);
      sf::Text::setString(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      sf::String::~String((String *)0x1a9826);
      std::locale::~locale(local_98);
      *(int *)(in_RDI + 0x648) = *(int *)(in_RDI + 0x648) + 1;
      this_01 = (Transformable *)(in_RDI + 0x4f8);
      VVar1 = sf::Text::findCharacterPos(in_stack_ffffffffffffff48,(size_t)local_c8);
      local_a0 = VVar1.x;
      sf::Transformable::setPosition(this_01,local_a0,2.0);
    }
    std::__cxx11::string::~string(local_30);
  }
  return false;
}

Assistant:

bool TextField::update(Event::TextEvent textEvent) {
    if (visible && isEditable && selected) {
        string s = field.getString();
        if (textEvent.unicode == 8 && caretPosition > 0) {    // Backspace.
            s.erase(caretPosition - 1, 1);
            field.setString(s);
            --caretPosition;
            caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
        } else if (textEvent.unicode == 27) {    // Escape.
            selected = false;
        } else if (textEvent.unicode >= 32 && textEvent.unicode <= 126 && static_cast<int>(s.length()) < maxCharacters) {    // Printable character.
            s.insert(caretPosition, 1, static_cast<char>(textEvent.unicode));
            field.setString(s);
            ++caretPosition;
            caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
        }
    }
    return false;
}